

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool __thiscall re2::CharClassBuilder::Contains(CharClassBuilder *this,Rune r)

{
  iterator iVar1;
  key_type local_10;
  
  local_10.lo = r;
  local_10.hi = r;
  iVar1 = std::
          _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
          ::find(&(this->ranges_)._M_t,&local_10);
  return (_Rb_tree_header *)iVar1._M_node != &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool CharClassBuilder::Contains(Rune r) {
  return ranges_.find(RuneRange(r, r)) != end();
}